

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVIntHelpers.h
# Opt level: O0

bool slang::addGeneral(uint64_t *dst,uint64_t *x,uint64_t *y,uint32_t len)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  calc_out_t result;
  uint32_t i;
  uint8_t carry;
  uint32_t len_local;
  uint64_t *y_local;
  uint64_t *x_local;
  uint64_t *dst_local;
  
  bVar3 = false;
  for (i = 0; i < len; i = i + 1) {
    uVar1 = (ulong)bVar3;
    uVar2 = x[i] + y[i];
    bVar3 = CARRY8(x[i],y[i]) || CARRY8(uVar2,uVar1);
    dst[i] = uVar2 + uVar1;
  }
  return bVar3;
}

Assistant:

static bool addGeneral(uint64_t* dst, const uint64_t* x, const uint64_t* y, uint32_t len) {
    uint8_t carry = 0;
    for (uint32_t i = 0; i < len; i++) {
        calc_out_t result;
        carry = addcarry64(carry, x[i], y[i], &result);
        dst[i] = result;
    }
    return carry;
}